

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O1

void __thiscall ON_Extrusion::Destroy(ON_Extrusion *this)

{
  double dVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  if (this->m_profile != (ON_Curve *)0x0) {
    (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
    this->m_profile = (ON_Curve *)0x0;
  }
  (this->m_path).from.z = ON_3dPoint::Origin.z;
  dVar1 = ON_3dPoint::Origin.y;
  (this->m_path).from.x = ON_3dPoint::Origin.x;
  (this->m_path).from.y = dVar1;
  dVar1 = ON_3dPoint::Origin.y;
  (this->m_path).to.x = ON_3dPoint::Origin.x;
  (this->m_path).to.y = dVar1;
  (this->m_path).to.z = ON_3dPoint::Origin.z;
  (this->m_t).m_t[0] = 0.0;
  (this->m_t).m_t[1] = 1.0;
  dVar1 = (double)CONCAT44(ON_3dVector::ZeroVector.y._4_4_,ON_3dVector::ZeroVector.y._0_4_);
  (this->m_up).x = (double)CONCAT44(ON_3dVector::ZeroVector.x._4_4_,ON_3dVector::ZeroVector.x._0_4_)
  ;
  (this->m_up).y = dVar1;
  (this->m_up).z = ON_3dVector::ZeroVector.z;
  this->m_profile_count = 0;
  this->m_bCap[0] = false;
  this->m_bCap[1] = false;
  this->m_bHaveN[0] = false;
  this->m_bHaveN[1] = false;
  this->m_profile = (ON_Curve *)0x0;
  this->m_N[0].z = ON_3dVector::ZeroVector.z;
  dVar1 = (double)CONCAT44(ON_3dVector::ZeroVector.y._4_4_,ON_3dVector::ZeroVector.y._0_4_);
  this->m_N[0].x = (double)CONCAT44(ON_3dVector::ZeroVector.x._4_4_,ON_3dVector::ZeroVector.x._0_4_)
  ;
  this->m_N[0].y = dVar1;
  uVar4 = ON_3dVector::ZeroVector.y._4_4_;
  uVar3 = ON_3dVector::ZeroVector.y._0_4_;
  uVar2 = ON_3dVector::ZeroVector.x._4_4_;
  *(undefined4 *)&this->m_N[1].x = ON_3dVector::ZeroVector.x._0_4_;
  *(undefined4 *)((long)&this->m_N[1].x + 4) = uVar2;
  *(undefined4 *)&this->m_N[1].y = uVar3;
  *(undefined4 *)((long)&this->m_N[1].y + 4) = uVar4;
  this->m_N[1].z = ON_3dVector::ZeroVector.z;
  (this->m_path_domain).m_t[0] = 0.0;
  (this->m_path_domain).m_t[1] = 1.0;
  this->m_bTransposed = false;
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x17])(this,1);
  ON_Object::PurgeUserData((ON_Object *)this);
  return;
}

Assistant:

void ON_Extrusion::Destroy()
{
  if ( m_profile)
  {
    delete m_profile;
    m_profile = 0;
  }
  ON_ExtrusionInitializeHelper(*this);
  DestroyRuntimeCache();
  PurgeUserData();
}